

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::section::Type<28>::Type<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (Type<28> *this,HEAD *head,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *end,long *lineNumber,int MAT)

{
  double awr;
  int MF;
  double dVar1;
  int in_stack_ffffffffffffff98;
  vector<njoy::ENDFtk::section::Type<28>::SubshellData,_std::allocator<njoy::ENDFtk::section::Type<28>::SubshellData>_>
  local_48;
  
  MF = (head->super_StructureDivision).tail.fields._M_elems[2];
  awr = (head->super_StructureDivision).base.fields.
        super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
        super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
        _M_head_impl;
  dVar1 = (head->super_StructureDivision).base.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Head_base<0UL,_double,_false>._M_head_impl;
  readSequence<njoy::ENDFtk::section::Type<28>::SubshellData,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            (&local_48,(ENDFtk *)begin,end,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)lineNumber,(long *)(ulong)(uint)MAT,0x1c,MF,
             (int)((_Head_base<4UL,_long,_false> *)
                  ((long)&(head->super_StructureDivision).base.fields.
                          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                          super__Tuple_impl<2UL,_long,_long,_long,_long>.
                          super__Tuple_impl<3UL,_long,_long,_long> + 8))->_M_head_impl,
             in_stack_ffffffffffffff98);
  dVar1 = round(dVar1);
  Type(this,MF,(int)dVar1,awr,&local_48);
  std::
  vector<njoy::ENDFtk::section::Type<28>::SubshellData,_std::allocator<njoy::ENDFtk::section::Type<28>::SubshellData>_>
  ::~vector(&local_48);
  BaseWithoutMT<njoy::ENDFtk::section::Base>::
  readSEND<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(begin,end,lineNumber,MAT,0x1c);
  return;
}

Assistant:

Type ( HEAD& head,
       Iterator& begin,
       const Iterator& end,
       long& lineNumber,
       int MAT )
  try: Type( head.MT(), head.ZA(), head.AWR(),
             readSequence< SubshellData >( begin, end, lineNumber,
                                           MAT, 28, head.MT(), head.N1() ) ) {

    readSEND(begin, end, lineNumber, MAT, 28 );
  }
  catch( std::exception& e ) {

    Log::info
    ( "Encountered error while reading section {} of file 28 of material {}",
      head.MT(), MAT );
    throw e;
  }